

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c382::ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>::
ktxTexture1WriteTestBase(ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U> *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ktxTexture1WriteTestBase_0018cef8;
  WriterTestHelper<unsigned_short,_2U,_33324U>::WriterTestHelper
            (&(this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>);
  (this->helper).createInfo.super_ktxTextureCreateInfo.glInternalformat = 0x822c;
  return;
}

Assistant:

ktxTexture1WriteTestBase() { }